

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::Model::InternalSwap(Model *this,Model *other)

{
  Model *other_local;
  Model *this_local;
  
  google::protobuf::internal::InternalMetadata::InternalSwap
            (&(this->super_MessageLite)._internal_metadata_,
             &(other->super_MessageLite)._internal_metadata_);
  google::protobuf::internal::memswap<13>((char *)&this->description_,(char *)&other->description_);
  std::swap<CoreML::Specification::Model::TypeUnion>(&this->Type_,&other->Type_);
  std::swap<unsigned_int>(this->_oneof_case_,other->_oneof_case_);
  return;
}

Assistant:

void Model::InternalSwap(Model* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(Model, isupdatable_)
      + sizeof(Model::isupdatable_)
      - PROTOBUF_FIELD_OFFSET(Model, description_)>(
          reinterpret_cast<char*>(&description_),
          reinterpret_cast<char*>(&other->description_));
  swap(Type_, other->Type_);
  swap(_oneof_case_[0], other->_oneof_case_[0]);
}